

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

void __thiscall Rml::ElementHandleTargetData::SetDefiniteMargins(ElementHandleTargetData *this)

{
  ulong uVar1;
  anon_class_1_0_00000001 SetDefiniteMargin;
  
  uVar1 = *(ulong *)&this->computed->common;
  if ((uVar1 & 0x600000) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&SetDefiniteMargin,this->target,MarginTop,Top);
    uVar1 = *(ulong *)&this->computed->common;
  }
  if ((uVar1 & 0x3000000) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&SetDefiniteMargin,this->target,MarginRight,Right);
    uVar1 = *(ulong *)&this->computed->common;
  }
  if ((uVar1 & 0xc000000) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&SetDefiniteMargin,this->target,MarginBottom,Bottom);
    uVar1 = *(ulong *)&this->computed->common;
  }
  if ((uVar1 & 0x30000000) == 0) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&SetDefiniteMargin,this->target,MarginLeft,Left);
  }
  return;
}

Assistant:

void SetDefiniteMargins()
	{
		// Set any auto margins to their current value, since auto-margins may affect the size and position of an element.
		auto SetDefiniteMargin = [](Element* element, PropertyId margin_id, BoxEdge edge) {
			element->SetProperty(margin_id, Property(Math::Round(element->GetBox().GetEdge(BoxArea::Margin, edge)), Unit::PX));
		};
		using Style::Margin;
		if (computed.margin_top().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginTop, BoxEdge::Top);
		if (computed.margin_right().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginRight, BoxEdge::Right);
		if (computed.margin_bottom().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginBottom, BoxEdge::Bottom);
		if (computed.margin_left().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginLeft, BoxEdge::Left);
	}